

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O3

sunrealtype SUNStrToReal(char *str)

{
  double dVar1;
  char *end;
  char *pcStack_8;
  
  dVar1 = strtod(str,&pcStack_8);
  return dVar1;
}

Assistant:

sunrealtype SUNStrToReal(const char* str)
{
  char* end;
#if defined(SUNDIALS_EXTENDED_PRECISION)
  return strtold(str, &end);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  return strtod(str, &end);
#elif defined(SUNDIALS_SINGLE_PRECISION)
  return strtof(str, &end);
#else
#error \
  "SUNDIALS precision not defined, report to github.com/LLNL/sundials/issues"
#endif
}